

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

void prvTidyDeclareListItem(TidyDocImpl *doc,TidyOptionImpl *opt,ctmbstr name)

{
  ctmbstr str;
  uint uVar1;
  uint uVar2;
  TidyOptionId TVar3;
  tmbstr s1;
  tmbstr val;
  ulong uVar4;
  
  TVar3 = opt->id;
  str = (doc->config).value[TVar3].p;
  if (str == (ctmbstr)0x0) {
    s1 = (tmbstr)0x0;
    val = name;
  }
  else {
    uVar1 = prvTidytmbstrlen(name);
    uVar2 = prvTidytmbstrlen(str);
    s1 = prvTidytmbstrndup(doc->allocator,str,uVar2 + uVar1 + 3);
    prvTidytmbstrcat(s1,", ");
    prvTidytmbstrcat(s1,name);
    TVar3 = opt->id;
    val = s1;
  }
  uVar4 = (ulong)(TVar3 - TidyBlockTags);
  if (TVar3 - TidyBlockTags < 0x3e) {
    if ((0x1000000400010041U >> (uVar4 & 0x3f) & 1) == 0) {
      if (uVar4 == 0x31) {
        prvTidyDefineMutedMessage(doc,opt,name);
      }
      else if (uVar4 == 0x3d) {
        prvTidyDefinePriorityAttribute(doc,name);
      }
    }
    else {
      prvTidyDeclareUserTag(doc,opt,name);
    }
  }
  SetOptionValue(doc,opt->id,val);
  if (s1 != (tmbstr)0x0) {
    (*doc->allocator->vtbl->free)(doc->allocator,s1);
    return;
  }
  return;
}

Assistant:

void TY_(DeclareListItem)( TidyDocImpl* doc, const TidyOptionImpl* opt, ctmbstr name )
{
    ctmbstr prvval = cfgStr( doc, opt->id );
    tmbstr catval = NULL;
    ctmbstr theval = name;
    if ( prvval )
    {
        uint len = TY_(tmbstrlen)(name) + TY_(tmbstrlen)(prvval) + 3;
        catval = TY_(tmbstrndup)( doc->allocator, prvval, len );
        TY_(tmbstrcat)( catval, ", " );
        TY_(tmbstrcat)( catval, name );
        theval = catval;
    }

    switch ( opt->id )
    {
        case TidyPriorityAttributes:
            TY_(DefinePriorityAttribute)( doc, name );
            break;

        case TidyMuteReports:
            TY_(DefineMutedMessage)( doc, opt, name );
            break;

        case TidyInlineTags:
        case TidyBlockTags:
        case TidyEmptyTags:
        case TidyPreTags:
        case TidyCustomTags:
            TY_(DeclareUserTag)( doc, opt, name );
            break;

        default:
            break;
    }

    SetOptionValue( doc, opt->id, theval );
    if ( catval )
        TidyDocFree( doc, catval );
}